

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

int32_t icu_63::DayPeriodRulesDataSink::parseSetNum(char *setNumStr,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int local_28;
  int32_t digit;
  int32_t setNum;
  int32_t i;
  UErrorCode *errorCode_local;
  char *setNumStr_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = strncmp(setNumStr,"set",3);
    if (iVar2 == 0) {
      local_28 = 0;
      for (digit = 3; setNumStr[digit] != '\0'; digit = digit + 1) {
        iVar2 = setNumStr[digit] + -0x30;
        if ((iVar2 < 0) || (9 < iVar2)) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          return -1;
        }
        local_28 = local_28 * 10 + iVar2;
      }
      if (local_28 == 0) {
        *errorCode = U_INVALID_FORMAT_ERROR;
        setNumStr_local._4_4_ = -1;
      }
      else {
        setNumStr_local._4_4_ = local_28;
      }
    }
    else {
      *errorCode = U_INVALID_FORMAT_ERROR;
      setNumStr_local._4_4_ = -1;
    }
  }
  else {
    setNumStr_local._4_4_ = -1;
  }
  return setNumStr_local._4_4_;
}

Assistant:

static int32_t parseSetNum(const char *setNumStr, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) { return -1; }

        if (uprv_strncmp(setNumStr, "set", 3) != 0) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return -1;
        }

        int32_t i = 3;
        int32_t setNum = 0;
        while (setNumStr[i] != 0) {
            int32_t digit = setNumStr[i] - '0';
            if (digit < 0 || 9 < digit) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return -1;
            }
            setNum = 10 * setNum + digit;
            ++i;
        }

        // Rule set number must not be zero. (0 is used to indicate "not found" by hashmap.)
        // Currently ICU data conveniently starts numbering rule sets from 1.
        if (setNum == 0) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return -1;
        } else {
            return setNum;
        }
    }